

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_utils.cpp
# Opt level: O1

void HydroUtils::ComputeFluxes
               (Box *bx,Array4<double> *fx,Array4<double> *fy,Array4<double> *fz,
               Array4<const_double> *umac,Array4<const_double> *vmac,Array4<const_double> *wmac,
               Array4<const_double> *xed,Array4<const_double> *yed,Array4<const_double> *zed,
               Geometry *geom,int ncomp,bool fluxes_are_area_weighted)

{
  double dVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  double *pdVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  long lVar22;
  int iVar23;
  long lVar24;
  long lVar25;
  double *pdVar26;
  ulong uVar27;
  double *pdVar28;
  long lVar29;
  int iVar30;
  int iVar31;
  long lVar32;
  bool bVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double *local_c8;
  double *local_b8;
  
  if (fluxes_are_area_weighted) {
    dVar34 = (geom->super_CoordSys).dx[0];
    dVar1 = (geom->super_CoordSys).dx[1];
    dVar35 = (geom->super_CoordSys).dx[2];
    dVar36 = dVar1 * dVar35;
    dVar35 = dVar35 * dVar34;
    dVar34 = dVar34 * dVar1;
  }
  else {
    dVar36 = 1.0;
    dVar35 = 1.0;
    dVar34 = 1.0;
  }
  uVar2 = (bx->btype).itype;
  uVar21 = (ulong)(uint)ncomp;
  if (0 < ncomp) {
    lVar12 = fx->jstride;
    lVar13 = fx->kstride;
    lVar14 = fx->nstride;
    iVar23 = (fx->begin).z;
    lVar15 = umac->jstride;
    lVar16 = umac->kstride;
    iVar3 = (umac->begin).z;
    iVar4 = (bx->smallend).vect[1];
    lVar32 = (long)iVar4;
    iVar5 = (bx->smallend).vect[0];
    lVar24 = (long)iVar5;
    local_c8 = fx->p + (((lVar32 - (fx->begin).y) * lVar12 + lVar24) - (long)(fx->begin).x);
    iVar6 = (umac->begin).y;
    iVar7 = (umac->begin).x;
    pdVar17 = umac->p;
    lVar18 = xed->jstride;
    iVar31 = (~uVar2 & 1) + (bx->bigend).vect[0];
    local_b8 = xed->p + (((lVar32 - (xed->begin).y) * lVar18 + lVar24) - (long)(xed->begin).x);
    lVar19 = xed->kstride;
    lVar20 = xed->nstride;
    iVar8 = (xed->begin).z;
    iVar9 = (bx->smallend).vect[2];
    iVar10 = (bx->bigend).vect[2];
    iVar11 = (bx->bigend).vect[1];
    uVar27 = 0;
    do {
      iVar30 = iVar9;
      if (iVar9 <= iVar10) {
        do {
          if (iVar4 <= iVar11) {
            lVar25 = (long)iVar30;
            pdVar28 = (double *)((lVar25 - iVar23) * lVar13 * 8 + (long)local_c8);
            lVar22 = (long)pdVar17 +
                     (lVar25 - iVar3) * lVar16 * 8 +
                     lVar24 * 8 + (lVar32 - iVar6) * lVar15 * 8 + (long)iVar7 * -8;
            pdVar26 = (double *)((lVar25 - iVar8) * lVar19 * 8 + (long)local_b8);
            lVar25 = lVar32;
            do {
              if (iVar5 <= iVar31) {
                lVar29 = 0;
                do {
                  pdVar28[lVar29] = pdVar26[lVar29] * *(double *)(lVar22 + lVar29 * 8) * dVar36;
                  lVar29 = lVar29 + 1;
                } while ((iVar31 - iVar5) + 1 != (int)lVar29);
              }
              lVar25 = lVar25 + 1;
              pdVar28 = pdVar28 + lVar12;
              lVar22 = lVar22 + lVar15 * 8;
              pdVar26 = pdVar26 + lVar18;
            } while (iVar11 + 1 != (int)lVar25);
          }
          bVar33 = iVar30 != iVar10;
          iVar30 = iVar30 + 1;
        } while (bVar33);
      }
      uVar27 = uVar27 + 1;
      local_c8 = local_c8 + lVar14;
      local_b8 = local_b8 + lVar20;
    } while (uVar27 != uVar21);
  }
  if (0 < ncomp) {
    lVar12 = fy->jstride;
    lVar13 = fy->kstride;
    lVar14 = fy->nstride;
    iVar23 = (fy->begin).z;
    lVar15 = vmac->jstride;
    iVar31 = (bx->bigend).vect[1] + (uint)((uVar2 & 2) == 0);
    iVar3 = (bx->smallend).vect[1];
    lVar24 = (long)iVar3;
    iVar4 = (bx->smallend).vect[0];
    lVar32 = (long)iVar4;
    local_c8 = fy->p + (((lVar24 - (fy->begin).y) * lVar12 + lVar32) - (long)(fy->begin).x);
    iVar5 = (vmac->begin).y;
    iVar6 = (vmac->begin).x;
    lVar16 = yed->jstride;
    lVar18 = vmac->kstride;
    pdVar17 = vmac->p;
    iVar7 = (vmac->begin).z;
    local_b8 = yed->p + (((lVar24 - (yed->begin).y) * lVar16 + lVar32) - (long)(yed->begin).x);
    lVar19 = yed->kstride;
    lVar20 = yed->nstride;
    iVar8 = (yed->begin).z;
    iVar9 = (bx->bigend).vect[0];
    iVar10 = (bx->smallend).vect[2];
    iVar11 = (bx->bigend).vect[2];
    uVar27 = 0;
    do {
      iVar30 = iVar10;
      if (iVar10 <= iVar11) {
        do {
          if (iVar3 <= iVar31) {
            lVar25 = (long)iVar30;
            pdVar28 = (double *)((lVar25 - iVar23) * lVar13 * 8 + (long)local_c8);
            lVar22 = (long)pdVar17 +
                     (lVar25 - iVar7) * lVar18 * 8 +
                     lVar32 * 8 + (lVar24 - iVar5) * lVar15 * 8 + (long)iVar6 * -8;
            pdVar26 = (double *)((lVar25 - iVar8) * lVar19 * 8 + (long)local_b8);
            lVar25 = lVar24;
            do {
              if (iVar4 <= iVar9) {
                lVar29 = 0;
                do {
                  pdVar28[lVar29] = pdVar26[lVar29] * *(double *)(lVar22 + lVar29 * 8) * dVar35;
                  lVar29 = lVar29 + 1;
                } while ((iVar9 - iVar4) + 1 != (int)lVar29);
              }
              lVar25 = lVar25 + 1;
              pdVar28 = pdVar28 + lVar12;
              lVar22 = lVar22 + lVar15 * 8;
              pdVar26 = pdVar26 + lVar16;
            } while (iVar31 + 1 != (int)lVar25);
          }
          bVar33 = iVar30 != iVar11;
          iVar30 = iVar30 + 1;
        } while (bVar33);
      }
      uVar27 = uVar27 + 1;
      local_c8 = local_c8 + lVar14;
      local_b8 = local_b8 + lVar20;
    } while (uVar27 != uVar21);
  }
  iVar23 = (bx->bigend).vect[2] + (uint)((uVar2 & 4) == 0);
  if (0 < ncomp) {
    lVar12 = fz->jstride;
    lVar13 = fz->kstride;
    lVar14 = fz->nstride;
    iVar3 = (fz->begin).z;
    lVar15 = wmac->jstride;
    iVar4 = (bx->smallend).vect[1];
    lVar24 = (long)iVar4;
    iVar5 = (bx->smallend).vect[0];
    lVar32 = (long)iVar5;
    local_c8 = fz->p + (((lVar24 - (fz->begin).y) * lVar12 + lVar32) - (long)(fz->begin).x);
    iVar6 = (wmac->begin).y;
    iVar7 = (wmac->begin).x;
    lVar16 = zed->jstride;
    lVar18 = wmac->kstride;
    pdVar17 = wmac->p;
    iVar8 = (wmac->begin).z;
    local_b8 = zed->p + (((lVar24 - (zed->begin).y) * lVar16 + lVar32) - (long)(zed->begin).x);
    lVar19 = zed->kstride;
    lVar20 = zed->nstride;
    iVar9 = (zed->begin).z;
    iVar10 = (bx->smallend).vect[2];
    iVar11 = (bx->bigend).vect[0];
    iVar31 = (bx->bigend).vect[1];
    uVar27 = 0;
    do {
      iVar30 = iVar10;
      if (iVar10 <= iVar23) {
        do {
          if (iVar4 <= iVar31) {
            lVar25 = (long)iVar30;
            pdVar28 = (double *)((lVar25 - iVar3) * lVar13 * 8 + (long)local_c8);
            lVar22 = (long)pdVar17 +
                     (lVar25 - iVar8) * lVar18 * 8 +
                     lVar32 * 8 + (lVar24 - iVar6) * lVar15 * 8 + (long)iVar7 * -8;
            pdVar26 = (double *)((lVar25 - iVar9) * lVar19 * 8 + (long)local_b8);
            lVar25 = lVar24;
            do {
              if (iVar5 <= iVar11) {
                lVar29 = 0;
                do {
                  pdVar28[lVar29] = pdVar26[lVar29] * *(double *)(lVar22 + lVar29 * 8) * dVar34;
                  lVar29 = lVar29 + 1;
                } while ((iVar11 - iVar5) + 1 != (int)lVar29);
              }
              lVar25 = lVar25 + 1;
              pdVar28 = pdVar28 + lVar12;
              lVar22 = lVar22 + lVar15 * 8;
              pdVar26 = pdVar26 + lVar16;
            } while (iVar31 + 1 != (int)lVar25);
          }
          bVar33 = iVar30 != iVar23;
          iVar30 = iVar30 + 1;
        } while (bVar33);
      }
      uVar27 = uVar27 + 1;
      local_c8 = local_c8 + lVar14;
      local_b8 = local_b8 + lVar20;
    } while (uVar27 != uVar21);
  }
  return;
}

Assistant:

void
HydroUtils::ComputeFluxes ( Box const& bx,
                            AMREX_D_DECL( Array4<Real> const& fx,
                                          Array4<Real> const& fy,
                                          Array4<Real> const& fz),
                            AMREX_D_DECL( Array4<Real const> const& umac,
                                          Array4<Real const> const& vmac,
                                          Array4<Real const> const& wmac),
                            AMREX_D_DECL( Array4<Real const> const& xed,
                                          Array4<Real const> const& yed,
                                          Array4<Real const> const& zed),
                            Geometry const& geom, const int ncomp,
                            const bool fluxes_are_area_weighted )
{
#if (AMREX_SPACEDIM == 2)
    if (geom.IsRZ()) {
        // Need metrics when using RZ
        Array<FArrayBox,AMREX_SPACEDIM> area;
        Array<Elixir,AMREX_SPACEDIM> area_eli;
        if (fluxes_are_area_weighted) {
            for (int dir = 0; dir < AMREX_SPACEDIM; ++dir)
            {
                const int ngrow_area = 0;
                geom.GetFaceArea(area[dir],BoxArray(bx),0,dir,ngrow_area);
                area_eli[dir] = area[dir].elixir();
            }
        }
        const auto& ax = (fluxes_are_area_weighted) ? area[0].const_array()
                                                    : Array4<const Real>{};
        const auto& ay = (fluxes_are_area_weighted) ? area[1].const_array()
                                                    : Array4<const Real>{};
        //
        //  X flux
        //
        const Box& xbx = amrex::surroundingNodes(bx,0);
        amrex::ParallelFor(xbx, ncomp, [fx, umac, xed, ax, fluxes_are_area_weighted]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            if (fluxes_are_area_weighted) {
                fx(i,j,k,n) = xed(i,j,k,n) * umac(i,j,k) * ax(i,j,k);
            } else {
                fx(i,j,k,n) = xed(i,j,k,n) * umac(i,j,k);
            }
        });

        //
        //  Y flux
        //
        const Box& ybx = amrex::surroundingNodes(bx,1);
        amrex::ParallelFor(ybx, ncomp, [fy, vmac, yed, ay, fluxes_are_area_weighted]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            if (fluxes_are_area_weighted) {
                fy(i,j,k,n) = yed(i,j,k,n) * vmac(i,j,k) * ay(i,j,k);
            } else {
                fy(i,j,k,n) = yed(i,j,k,n) * vmac(i,j,k);
            }
        });
    } else
#endif
    {
        const auto dx = geom.CellSizeArray();

        GpuArray<Real,AMREX_SPACEDIM> area;
#if ( AMREX_SPACEDIM == 3 )
        if (fluxes_are_area_weighted) {
            area[0] = dx[1]*dx[2];
            area[1] = dx[0]*dx[2];
            area[2] = dx[0]*dx[1];
        } else {
            area[0] = 1.; area[1] = 1.; area[2] = 1.;
        }
#else
        if (fluxes_are_area_weighted) {
            area[0] = dx[1];
            area[1] = dx[0];
        } else {
            area[0] = 1.; area[1] = 1.;
        }
#endif

        //
        //  X flux
        //
        const Box& xbx = amrex::surroundingNodes(bx,0);
        amrex::ParallelFor(xbx, ncomp, [fx, umac, xed, area]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            fx(i,j,k,n) = xed(i,j,k,n) * umac(i,j,k) * area[0];
        });

        //
        //  Y flux
        //
        const Box& ybx = amrex::surroundingNodes(bx,1);
        amrex::ParallelFor(ybx, ncomp, [fy, vmac, yed, area]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            fy(i,j,k,n) = yed(i,j,k,n) * vmac(i,j,k) * area[1];
        });

#if ( AMREX_SPACEDIM == 3 )
        //
        //  Z flux
        //
        const Box& zbx = amrex::surroundingNodes(bx,2);
        amrex::ParallelFor(zbx, ncomp, [fz, wmac, zed, area]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            fz(i,j,k,n) = zed(i,j,k,n) * wmac(i,j,k) * area[2];
        });
#endif
    }

}